

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.H
# Opt level: O2

void EBUserDefined(Geometry *param_1,int param_2,int param_3)

{
  amrex::Abort_host(
                   "In default EBUserDefined function! Shouldn\'t be here. Copy and edit this file for your needs"
                   );
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE AMREX_FORCE_INLINE
    void Abort (const char * msg = 0) {
#if AMREX_DEVICE_COMPILE
#if defined(NDEBUG)
        amrex::ignore_unused(msg);
#else
        if (msg) AMREX_DEVICE_PRINTF("Abort %s\n", msg);
        AMREX_DEVICE_ASSERT(0);
#endif
#else
        Abort_host(msg);
#endif
    }